

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O3

int save_image_as_DDS(char *filename,int width,int height,int channels,uchar *data)

{
  int iVar1;
  int iVar2;
  uchar *__ptr;
  FILE *__s;
  int DDS_size;
  DDS_header header;
  int local_ac;
  undefined8 local_a8;
  undefined4 local_a0;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  iVar1 = 0;
  iVar2 = 0;
  if ((((data != (uchar *)0x0) && (iVar2 = 0, filename != (char *)0x0)) &&
      (iVar2 = iVar1, 0 < width)) && ((0 < height && (0xfffffffb < channels - 5U)))) {
    if ((channels & 1U) == 0) {
      __ptr = convert_image_to_DXT5(data,width,height,channels,&local_ac);
      uStack_54 = 0x35545844;
    }
    else {
      __ptr = convert_image_to_DXT1(data,width,height,channels,&local_ac);
      uStack_54 = 0x31545844;
    }
    local_60 = 0;
    uStack_38 = 0;
    local_50 = 0;
    uStack_48 = 0;
    local_70 = 0;
    uStack_68 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_90 = 0;
    uStack_88 = 0;
    local_30 = 0;
    local_a8 = 0x7c20534444;
    local_a0 = 0x81007;
    local_94 = local_ac;
    uStack_5c = 0x20;
    uStack_58 = 4;
    local_40 = 0x100000000000;
    local_9c = height;
    local_98 = width;
    __s = fopen(filename,"wb");
    fwrite(&local_a8,0x80,1,__s);
    fwrite(__ptr,1,(long)local_ac,__s);
    fclose(__s);
    free(__ptr);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
	save_image_as_DDS
	(
		const char *filename,
		int width, int height, int channels,
		const unsigned char *const data
	)
{
	/*	variables	*/
	FILE *fout;
	unsigned char *DDS_data;
	DDS_header header;
	int DDS_size;
	/*	error check	*/
	if( (NULL == filename) ||
		(width < 1) || (height < 1) ||
		(channels < 1) || (channels > 4) ||
		(data == NULL ) )
	{
		return 0;
	}
	/*	Convert the image	*/
	if( (channels & 1) == 1 )
	{
		/*	no alpha, just use DXT1	*/
		DDS_data = convert_image_to_DXT1( data, width, height, channels, &DDS_size );
	} else
	{
		/*	has alpha, so use DXT5	*/
		DDS_data = convert_image_to_DXT5( data, width, height, channels, &DDS_size );
	}
	/*	save it	*/
	memset( &header, 0, sizeof( DDS_header ) );
	header.dwMagic = ('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24);
	header.dwSize = 124;
	header.dwFlags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT | DDSD_LINEARSIZE;
	header.dwWidth = width;
	header.dwHeight = height;
	header.dwPitchOrLinearSize = DDS_size;
	header.sPixelFormat.dwSize = 32;
	header.sPixelFormat.dwFlags = DDPF_FOURCC;
	if( (channels & 1) == 1 )
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('1' << 24);
	} else
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('5' << 24);
	}
	header.sCaps.dwCaps1 = DDSCAPS_TEXTURE;
	/*	write it out	*/
	fout = fopen( filename, "wb");
	fwrite( &header, sizeof( DDS_header ), 1, fout );
	fwrite( DDS_data, 1, DDS_size, fout );
	fclose( fout );
	/*	done	*/
	free( DDS_data );
	return 1;
}